

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_a::_Test_L0_CompactionBug_Issue44_a
          (_Test_L0_CompactionBug_Issue44_a *this)

{
  _Test_L0_CompactionBug_Issue44_a *this_local;
  
  DBTest::DBTest(&this->super_DBTest);
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_a) {
  Reopen();
  ASSERT_OK(Put("b", "v"));
  Reopen();
  ASSERT_OK(Delete("b"));
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Put("a", "v"));
  Reopen();
  Reopen();
  ASSERT_EQ("(a->v)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(a->v)", Contents());
}